

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

SPVFuncImpl __thiscall
spirv_cross::CompilerMSL::OpCodePreprocessor::get_spv_func_impl
          (OpCodePreprocessor *this,Op opcode,uint32_t *args,uint32_t length)

{
  uint32_t uVar1;
  SPVFuncImpl SVar2;
  char cVar3;
  __node_base_ptr p_Var4;
  SPIRVariable *pSVar5;
  ulong uVar6;
  mapped_type *pmVar7;
  SPIRType *pSVar8;
  SPIRExtension *pSVar9;
  SPVFuncImpl SVar10;
  _Hash_node_base *p_Var11;
  bool bVar12;
  
  if ((int)opcode < 0x150) {
    if (0xe2 < (int)opcode) {
      if (opcode - OpAtomicLoad < 0x10) goto LAB_0023a7c6;
      goto switchD_0023a755_caseD_82;
    }
    if (0x73 < (int)opcode) {
      switch(opcode) {
      case OpFAdd:
      case OpFSub:
        if (((this->compiler->msl_options).invariant_float_math != false) ||
           (bVar12 = Compiler::has_decoration
                               ((Compiler *)this->compiler,(ID)args[1],DecorationNoContraction),
           bVar12)) {
          return opcode == OpFAdd ^ SPVFuncImplFSub;
        }
        break;
      case OpISub:
      case OpIMul:
      case OpUDiv:
      case OpSDiv:
      case OpFDiv:
      case OpUMod:
      case OpSRem:
      case OpSMod:
      case OpFRem:
      case OpVectorTimesScalar:
      case OpMatrixTimesScalar:
      case OpDot:
      case OpIAddCarry:
      case OpISubBorrow:
        break;
      case OpFMul:
      case OpVectorTimesMatrix:
      case OpMatrixTimesVector:
      case OpMatrixTimesMatrix:
      case OpOuterProduct:
        if ((this->compiler->msl_options).invariant_float_math != false) {
          return SPVFuncImplFMul;
        }
        bVar12 = Compiler::has_decoration
                           ((Compiler *)this->compiler,(ID)args[1],DecorationNoContraction);
        if (bVar12) {
          return SPVFuncImplFMul;
        }
        break;
      case OpFMod:
        return SPVFuncImplMod;
      case OpUMulExtended:
      case OpSMulExtended:
        return SPVFuncImplMulExtended;
      default:
        if (opcode == OpQuantizeToF16) {
          return SPVFuncImplQuantizeToF16;
        }
      }
      goto switchD_0023a755_caseD_82;
    }
    if (0x61 < (int)opcode) {
      if (opcode - OpImageRead < 2) {
LAB_0023a8ce:
        pmVar7 = ::std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->result_types,args + (ulong)(opcode != OpImageWrite) * 2);
        if ((((ulong)*pmVar7 != 0) &&
            (pSVar8 = Variant::get<spirv_cross::SPIRType>
                                ((this->compiler->super_CompilerGLSL).super_Compiler.ir.ids.
                                 super_VectorView<spirv_cross::Variant>.ptr + *pmVar7),
            (pSVar8->image).dim == DimBuffer)) &&
           ((this->compiler->msl_options).texture_buffer_native == false)) {
          return SPVFuncImplTexelBufferCoords;
        }
      }
      goto switchD_0023a755_caseD_82;
    }
    if (opcode != OpExtInst) {
      if (opcode == OpTypeArray) {
        return SPVFuncImplUnsafeArray;
      }
      if (opcode == OpImageFetch) goto LAB_0023a8ce;
      goto switchD_0023a755_caseD_82;
    }
    pSVar9 = Variant::get<spirv_cross::SPIRExtension>
                       ((this->compiler->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr + args[2]);
    SVar2 = SPVFuncImplGradientCube;
    SVar10 = SPVFuncImplGradientCube;
    if (*(int *)&(pSVar9->super_IVariant).field_0xc != 1) {
      bVar12 = false;
      goto LAB_0023ab5b;
    }
    uVar1 = args[3];
    cVar3 = '\x01';
    SVar10 = SVar2;
    if ((int)uVar1 < 0x22) {
      if (uVar1 == 7) {
        SVar10 = SPVFuncImplSSign;
      }
      else if (uVar1 == 0xb) {
        SVar10 = SPVFuncImplRadians;
      }
      else {
        if (uVar1 != 0xc) goto LAB_0023ab53;
        SVar10 = SPVFuncImplDegrees;
      }
      goto LAB_0023ab55;
    }
    switch(uVar1) {
    case 0x46:
      pSVar8 = Variant::get<spirv_cross::SPIRType>
                         ((this->compiler->super_CompilerGLSL).super_Compiler.ir.ids.
                          super_VectorView<spirv_cross::Variant>.ptr + *args);
      bVar12 = pSVar8->vecsize != 1;
      SVar10 = SPVFuncImplFaceForwardScalar;
      if (bVar12) goto LAB_0023ab53;
      goto LAB_0023ab2f;
    case 0x47:
      pSVar8 = Variant::get<spirv_cross::SPIRType>
                         ((this->compiler->super_CompilerGLSL).super_Compiler.ir.ids.
                          super_VectorView<spirv_cross::Variant>.ptr + *args);
      uVar1 = pSVar8->vecsize;
      SVar10 = SPVFuncImplReflectScalar;
      goto joined_r0x0023ab02;
    case 0x48:
      pSVar8 = Variant::get<spirv_cross::SPIRType>
                         ((this->compiler->super_CompilerGLSL).super_Compiler.ir.ids.
                          super_VectorView<spirv_cross::Variant>.ptr + *args);
      uVar1 = pSVar8->vecsize;
      SVar10 = SPVFuncImplRefractScalar;
joined_r0x0023ab02:
      bVar12 = uVar1 != 1;
      if (bVar12) {
LAB_0023ab53:
        cVar3 = '\0';
      }
      else {
LAB_0023ab2f:
        cVar3 = bVar12 * '\x02' + '\x01';
      }
      break;
    case 0x49:
      SVar10 = SPVFuncImplFindILsb;
      break;
    case 0x4a:
      SVar10 = SPVFuncImplFindSMsb;
      break;
    case 0x4b:
      SVar10 = SPVFuncImplFindUMsb;
      break;
    default:
      if (uVar1 != 0x22) goto LAB_0023ab53;
      pSVar8 = Variant::get<spirv_cross::SPIRType>
                         ((this->compiler->super_CompilerGLSL).super_Compiler.ir.ids.
                          super_VectorView<spirv_cross::Variant>.ptr + *args);
      uVar1 = pSVar8->columns;
      cVar3 = '\x01';
      if (uVar1 == 2) {
        SVar10 = SPVFuncImplInverse2x2;
LAB_0023ab44:
        bVar12 = false;
      }
      else {
        if (uVar1 == 4) {
          SVar10 = SPVFuncImplInverse4x4;
          goto LAB_0023ab44;
        }
        if (uVar1 == 3) {
          SVar10 = SPVFuncImplInverse3x3;
          goto LAB_0023ab44;
        }
        cVar3 = '\x03';
        bVar12 = true;
      }
      if (bVar12) goto LAB_0023ab53;
    }
LAB_0023ab55:
    bVar12 = cVar3 == '\x01';
LAB_0023ab5b:
    if (bVar12) {
      return SVar10;
    }
switchD_0023a755_caseD_82:
    SVar10 = SPVFuncImplNone;
  }
  else {
    if (0x1161 < (int)opcode) {
      if (opcode - OpSDot < 6) {
        return SPVFuncImplReduceAdd;
      }
      if (opcode - OpAssumeTrueKHR < 2) {
        return SPVFuncImplAssume;
      }
      if (opcode == OpAtomicFAddEXT) {
LAB_0023a7c6:
        uVar6 = (ulong)args[(ulong)(opcode != OpAtomicStore) * 2];
        p_Var11 = (_Hash_node_base *)0x0;
        p_Var4 = ::std::
                 _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::_M_find_before_node
                           (&(this->image_pointers_emulated)._M_h,
                            uVar6 % (this->image_pointers_emulated)._M_h._M_bucket_count,
                            args + (ulong)(opcode != OpAtomicStore) * 2,uVar6);
        if (p_Var4 != (__node_base_ptr)0x0) {
          p_Var11 = p_Var4->_M_nxt;
        }
        if (p_Var11 != (_Hash_node_base *)0x0) {
          pSVar5 = Variant::get<spirv_cross::SPIRVariable>
                             ((this->compiler->super_CompilerGLSL).super_Compiler.ir.ids.
                              super_VectorView<spirv_cross::Variant>.ptr +
                              *(uint *)((long)&p_Var11[1]._M_nxt + 4));
          uVar6 = (ulong)*(uint *)&(pSVar5->super_IVariant).field_0xc;
          if ((uVar6 != 0) &&
             (pSVar8 = Variant::get<spirv_cross::SPIRType>
                                 ((this->compiler->super_CompilerGLSL).super_Compiler.ir.ids.
                                  super_VectorView<spirv_cross::Variant>.ptr + uVar6),
             (pSVar8->image).dim == Dim2D)) {
            return SPVFuncImplImage2DAtomicCoords;
          }
        }
      }
      goto switchD_0023a755_caseD_82;
    }
    switch(opcode) {
    case OpGroupNonUniformAllEqual:
switchD_0023a7ae_caseD_150:
      SVar10 = SPVFuncImplSubgroupAllEqual;
      break;
    case OpGroupNonUniformBroadcast:
switchD_0023a7ae_caseD_151:
      SVar10 = SPVFuncImplSubgroupBroadcast;
      break;
    case OpGroupNonUniformBroadcastFirst:
switchD_0023a7ae_caseD_152:
      SVar10 = SPVFuncImplSubgroupBroadcastFirst;
      break;
    case OpGroupNonUniformBallot:
switchD_0023a7ae_caseD_153:
      SVar10 = SPVFuncImplSubgroupBallot;
      break;
    case OpGroupNonUniformInverseBallot:
    case OpGroupNonUniformBallotBitExtract:
      SVar10 = SPVFuncImplSubgroupBallotBitExtract;
      break;
    case OpGroupNonUniformBallotBitCount:
      SVar10 = SPVFuncImplSubgroupBallotBitCount;
      break;
    case OpGroupNonUniformBallotFindLSB:
      SVar10 = SPVFuncImplSubgroupBallotFindLSB;
      break;
    case OpGroupNonUniformBallotFindMSB:
      SVar10 = SPVFuncImplSubgroupBallotFindMSB;
      break;
    case OpGroupNonUniformShuffle:
      SVar10 = SPVFuncImplSubgroupShuffle;
      break;
    case OpGroupNonUniformShuffleXor:
      SVar10 = SPVFuncImplSubgroupShuffleXor;
      break;
    case OpGroupNonUniformShuffleUp:
      SVar10 = SPVFuncImplSubgroupShuffleUp;
      break;
    case OpGroupNonUniformShuffleDown:
      SVar10 = SPVFuncImplSubgroupShuffleDown;
      break;
    case OpGroupNonUniformIAdd:
    case OpGroupNonUniformFAdd:
    case OpGroupNonUniformIMul:
    case OpGroupNonUniformFMul:
    case OpGroupNonUniformSMin:
    case OpGroupNonUniformUMin:
    case OpGroupNonUniformFMin:
    case OpGroupNonUniformSMax:
    case OpGroupNonUniformUMax:
    case OpGroupNonUniformFMax:
    case OpGroupNonUniformBitwiseAnd:
    case OpGroupNonUniformBitwiseOr:
    case OpGroupNonUniformBitwiseXor:
    case OpGroupNonUniformLogicalAnd:
    case OpGroupNonUniformLogicalOr:
    case OpGroupNonUniformLogicalXor:
      goto switchD_0023a755_caseD_82;
    case OpGroupNonUniformQuadBroadcast:
      SVar10 = SPVFuncImplQuadBroadcast;
      break;
    case OpGroupNonUniformQuadSwap:
      SVar10 = SPVFuncImplQuadSwap;
      break;
    default:
      switch(opcode) {
      case OpSubgroupBallotKHR:
        goto switchD_0023a7ae_caseD_153;
      case OpSubgroupFirstInvocationKHR:
        goto switchD_0023a7ae_caseD_152;
      default:
        goto switchD_0023a755_caseD_82;
      case OpSubgroupAllEqualKHR:
        goto switchD_0023a7ae_caseD_150;
      case OpGroupNonUniformRotateKHR:
        return (length < 6) * '\x04' + SPVFuncImplSubgroupShuffle;
      case OpSubgroupReadInvocationKHR:
        goto switchD_0023a7ae_caseD_151;
      }
    }
  }
  return SVar10;
}

Assistant:

CompilerMSL::SPVFuncImpl CompilerMSL::OpCodePreprocessor::get_spv_func_impl(Op opcode, const uint32_t *args, uint32_t length)
{
	switch (opcode)
	{
	case OpFMod:
		return SPVFuncImplMod;

	case OpFAdd:
	case OpFSub:
		if (compiler.msl_options.invariant_float_math ||
		    compiler.has_decoration(args[1], DecorationNoContraction))
		{
			return opcode == OpFAdd ? SPVFuncImplFAdd : SPVFuncImplFSub;
		}
		break;

	case OpFMul:
	case OpOuterProduct:
	case OpMatrixTimesVector:
	case OpVectorTimesMatrix:
	case OpMatrixTimesMatrix:
		if (compiler.msl_options.invariant_float_math ||
		    compiler.has_decoration(args[1], DecorationNoContraction))
		{
			return SPVFuncImplFMul;
		}
		break;

	case OpQuantizeToF16:
		return SPVFuncImplQuantizeToF16;

	case OpTypeArray:
	{
		// Allow Metal to use the array<T> template to make arrays a value type
		return SPVFuncImplUnsafeArray;
	}

	// Emulate texture2D atomic operations
	case OpAtomicExchange:
	case OpAtomicCompareExchange:
	case OpAtomicCompareExchangeWeak:
	case OpAtomicIIncrement:
	case OpAtomicIDecrement:
	case OpAtomicIAdd:
	case OpAtomicFAddEXT:
	case OpAtomicISub:
	case OpAtomicSMin:
	case OpAtomicUMin:
	case OpAtomicSMax:
	case OpAtomicUMax:
	case OpAtomicAnd:
	case OpAtomicOr:
	case OpAtomicXor:
	case OpAtomicLoad:
	case OpAtomicStore:
	{
		auto it = image_pointers_emulated.find(args[opcode == OpAtomicStore ? 0 : 2]);
		if (it != image_pointers_emulated.end())
		{
			uint32_t tid = compiler.get<SPIRVariable>(it->second).basetype;
			if (tid && compiler.get<SPIRType>(tid).image.dim == Dim2D)
				return SPVFuncImplImage2DAtomicCoords;
		}
		break;
	}

	case OpImageFetch:
	case OpImageRead:
	case OpImageWrite:
	{
		// Retrieve the image type, and if it's a Buffer, emit a texel coordinate function
		uint32_t tid = result_types[args[opcode == OpImageWrite ? 0 : 2]];
		if (tid && compiler.get<SPIRType>(tid).image.dim == DimBuffer && !compiler.msl_options.texture_buffer_native)
			return SPVFuncImplTexelBufferCoords;
		break;
	}

	case OpExtInst:
	{
		uint32_t extension_set = args[2];
		if (compiler.get<SPIRExtension>(extension_set).ext == SPIRExtension::GLSL)
		{
			auto op_450 = static_cast<GLSLstd450>(args[3]);
			switch (op_450)
			{
			case GLSLstd450Radians:
				return SPVFuncImplRadians;
			case GLSLstd450Degrees:
				return SPVFuncImplDegrees;
			case GLSLstd450FindILsb:
				return SPVFuncImplFindILsb;
			case GLSLstd450FindSMsb:
				return SPVFuncImplFindSMsb;
			case GLSLstd450FindUMsb:
				return SPVFuncImplFindUMsb;
			case GLSLstd450SSign:
				return SPVFuncImplSSign;
			case GLSLstd450Reflect:
			{
				auto &type = compiler.get<SPIRType>(args[0]);
				if (type.vecsize == 1)
					return SPVFuncImplReflectScalar;
				break;
			}
			case GLSLstd450Refract:
			{
				auto &type = compiler.get<SPIRType>(args[0]);
				if (type.vecsize == 1)
					return SPVFuncImplRefractScalar;
				break;
			}
			case GLSLstd450FaceForward:
			{
				auto &type = compiler.get<SPIRType>(args[0]);
				if (type.vecsize == 1)
					return SPVFuncImplFaceForwardScalar;
				break;
			}
			case GLSLstd450MatrixInverse:
			{
				auto &mat_type = compiler.get<SPIRType>(args[0]);
				switch (mat_type.columns)
				{
				case 2:
					return SPVFuncImplInverse2x2;
				case 3:
					return SPVFuncImplInverse3x3;
				case 4:
					return SPVFuncImplInverse4x4;
				default:
					break;
				}
				break;
			}
			default:
				break;
			}
		}
		break;
	}

	case OpGroupNonUniformBroadcast:
	case OpSubgroupReadInvocationKHR:
		return SPVFuncImplSubgroupBroadcast;

	case OpGroupNonUniformBroadcastFirst:
	case OpSubgroupFirstInvocationKHR:
		return SPVFuncImplSubgroupBroadcastFirst;

	case OpGroupNonUniformBallot:
	case OpSubgroupBallotKHR:
		return SPVFuncImplSubgroupBallot;

	case OpGroupNonUniformInverseBallot:
	case OpGroupNonUniformBallotBitExtract:
		return SPVFuncImplSubgroupBallotBitExtract;

	case OpGroupNonUniformBallotFindLSB:
		return SPVFuncImplSubgroupBallotFindLSB;

	case OpGroupNonUniformBallotFindMSB:
		return SPVFuncImplSubgroupBallotFindMSB;

	case OpGroupNonUniformBallotBitCount:
		return SPVFuncImplSubgroupBallotBitCount;

	case OpGroupNonUniformAllEqual:
	case OpSubgroupAllEqualKHR:
		return SPVFuncImplSubgroupAllEqual;

	case OpGroupNonUniformShuffle:
		return SPVFuncImplSubgroupShuffle;

	case OpGroupNonUniformShuffleXor:
		return SPVFuncImplSubgroupShuffleXor;

	case OpGroupNonUniformShuffleUp:
		return SPVFuncImplSubgroupShuffleUp;

	case OpGroupNonUniformShuffleDown:
		return SPVFuncImplSubgroupShuffleDown;

	case OpGroupNonUniformRotateKHR:
		// Clustered rotate is performed using shuffle.
		if (length > 5)
			return SPVFuncImplSubgroupShuffle;
		return SPVFuncImplSubgroupRotate;

	case OpGroupNonUniformQuadBroadcast:
		return SPVFuncImplQuadBroadcast;

	case OpGroupNonUniformQuadSwap:
		return SPVFuncImplQuadSwap;

	case OpSDot:
	case OpUDot:
	case OpSUDot:
	case OpSDotAccSat:
	case OpUDotAccSat:
	case OpSUDotAccSat:
		return SPVFuncImplReduceAdd;

	case OpSMulExtended:
	case OpUMulExtended:
		return SPVFuncImplMulExtended;

	case OpAssumeTrueKHR:
	case OpExpectKHR:
		return SPVFuncImplAssume;

	default:
		break;
	}
	return SPVFuncImplNone;
}